

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O0

void __thiscall
Js::AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>::
AuxPtrsFix(AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
           *this,AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                 *ptr16)

{
  bool bVar1;
  Type *local_28;
  byte local_1a;
  uint8 i_1;
  uint8 i;
  AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
  *ptr16_local;
  AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
  *this_local;
  
  local_28 = this->ptr;
  do {
    Memory::WriteBarrierPtr<void>::WriteBarrierPtr(local_28);
    local_28 = local_28 + 1;
  } while ((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
            *)local_28 != this + 1);
  this->count = '\x03';
  bVar1 = false;
  while (!bVar1) {
    this->type[0] = ptr16->type[0];
    Memory::WriteBarrierPtr<void>::operator=(this->ptr,ptr16->ptr);
    bVar1 = true;
  }
  for (local_1a = 1; local_1a < this->count; local_1a = local_1a + 1) {
    this->type[local_1a] = Invalid;
  }
  return;
}

Assistant:

AuxPtrsFix<FieldsEnum, size, _MaxCount>::AuxPtrsFix(AuxPtrsFix<FieldsEnum, 16>* ptr16)
    {
        static_assert(_MaxCount == AuxPtrsFix<FieldsEnum, 32>::MaxCount, "Should only be called on AuxPtrsFix<FieldsEnum, 32>");
        this->count = AuxPtrsFix<FieldsEnum, 32>::MaxCount;
        for (uint8 i = 0; i < AuxPtrsFix<FieldsEnum, 16>::MaxCount; i++)
        {
            this->type[i] = ptr16->type[i];
            this->ptr[i] = ptr16->ptr[i];
        }
        for (uint8 i = AuxPtrsFix<FieldsEnum, 16>::MaxCount; i < count; i++)
        {
            this->type[i] = FieldsEnum::Invalid;
        }
    }